

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

SourceCodeInfo * __thiscall google::protobuf::SourceCodeInfo::New(SourceCodeInfo *this,Arena *arena)

{
  SourceCodeInfo *this_00;
  
  this_00 = (SourceCodeInfo *)operator_new(0x30);
  SourceCodeInfo(this_00);
  if (arena != (Arena *)0x0) {
    Arena::Own<google::protobuf::SourceCodeInfo>(arena,this_00);
  }
  return this_00;
}

Assistant:

SourceCodeInfo* SourceCodeInfo::New(::google::protobuf::Arena* arena) const {
  SourceCodeInfo* n = new SourceCodeInfo;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}